

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Scene::set_draw_styles
          (Scene *this,DrawStyle *defaultStyle,DrawStyle *hoveredStyle,DrawStyle *selectedStyle)

{
  bool bVar1;
  reference ppSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffffb8;
  SceneObject *in_stack_ffffffffffffffc0;
  _Self local_38;
  _Self local_30;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  *(undefined8 *)(in_RDI + 0x110) = in_RSI;
  *(undefined8 *)(in_RDI + 0x118) = in_RDX;
  *(undefined8 *)(in_RDI + 0x120) = in_RCX;
  local_28 = in_RDI + 0x98;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_38._M_node =
       (_Base_ptr)
       std::
       set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 = *ppSVar2;
    (**in_stack_ffffffffffffffc0->_vptr_SceneObject)
              (in_stack_ffffffffffffffc0,local_10,local_18,local_20);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void Scene::set_draw_styles(DrawStyle *defaultStyle, DrawStyle *hoveredStyle,
                            DrawStyle *selectedStyle) {
  this->defaultStyle = defaultStyle;
  this->hoveredStyle = hoveredStyle;
  this->selectedStyle = selectedStyle;
  for (SceneObject *obj : objects) {
    obj->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
  }
}